

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask21_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = in[1];
  uVar2 = in[3];
  uVar3 = in[4];
  *out = uVar1 << 0x15 | *in;
  out[1] = uVar2 << 0x1f | in[2] << 10 | uVar1 >> 0xb;
  uVar1 = in[6];
  out[2] = uVar3 << 0x14 | uVar2 >> 1;
  uVar2 = in[7];
  out[3] = uVar1 << 0x1e | in[5] << 9 | uVar3 >> 0xc;
  out[4] = uVar2 << 0x13 | uVar1 >> 2;
  out[5] = uVar2 >> 0xd;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask21_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (21 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (21 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (21 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (21 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (21 - 8);
  ++in;

  return out + 1;
}